

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,uchar *zRaw)

{
  uchar *buf;
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  pgno iReal;
  pgno iLogic;
  
  iVar1 = pEngine->iPageSize;
  uVar3 = (ulong)pMap->iPtr;
  if (uVar3 == 0) {
    SyBigEndianUnpack64(zRaw,&pMap->iNext);
    SyBigEndianUnpack32(zRaw + 8,&pMap->nRec);
    uVar3 = 0xc;
  }
  uVar4 = 0;
  for (; (uVar4 < pMap->nRec && (buf = zRaw + uVar3, buf < zRaw + iVar1)); uVar3 = uVar3 + 0x10) {
    SyBigEndianUnpack64(buf,&iLogic);
    SyBigEndianUnpack64(buf + 8,&iReal);
    iVar2 = lhMapInstallBucket(pEngine,iLogic,iReal);
    if (iVar2 != 0) {
      return -1;
    }
    uVar4 = uVar4 + 1;
  }
  pMap->iPtr = (sxu16)uVar3;
  return 0;
}

Assistant:

static int lhMapLoadPage(lhash_kv_engine *pEngine,lhash_bmap_page *pMap,const unsigned char *zRaw)
{
	const unsigned char *zEnd = &zRaw[pEngine->iPageSize];
	const unsigned char *zPtr = zRaw;
	pgno iLogic,iReal;
	sxu32 n;
	int rc;
	if( pMap->iPtr == 0 ){
		/* Read the map header */
		SyBigEndianUnpack64(zRaw,&pMap->iNext);
		zRaw += 8;
		SyBigEndianUnpack32(zRaw,&pMap->nRec);
		zRaw += 4;
	}else{
		/* Mostly page one of the database */
		zRaw += pMap->iPtr;
	}
	/* Start processing */
	for( n = 0; n < pMap->nRec ; ++n ){
		if( zRaw >= zEnd ){
			break;
		}
		/* Extract the logical and real bucket number */
		SyBigEndianUnpack64(zRaw,&iLogic);
		zRaw += 8;
		SyBigEndianUnpack64(zRaw,&iReal);
		zRaw += 8;
		/* Install the record in the map */
		rc = lhMapInstallBucket(pEngine,iLogic,iReal);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	pMap->iPtr = (sxu16)(zRaw-zPtr);
	/* All done */
	return UNQLITE_OK;
}